

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

string * google::MungeLine(string *__return_storage_ptr__,string *line)

{
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  ulong uVar4;
  char *pcVar5;
  ostream *poVar6;
  string local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  undefined1 local_388 [8];
  string rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  CheckOpString local_328;
  LogMessage local_320;
  unsigned_long local_310;
  unsigned_long local_308;
  string *local_300;
  _Check_string *_result;
  size_t index;
  CheckOpString local_2d0;
  LogMessage local_2c8;
  char local_2b2;
  char local_2b1;
  string *local_2b0;
  _Check_string *_result_1;
  LogMessage local_2a0;
  LogMessageVoidify local_289;
  undefined1 local_288 [8];
  string tmp;
  LogMessage local_260;
  LogMessageVoidify local_24d;
  undefined4 local_24c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_218 [8];
  string thread_lineinfo;
  string time;
  string logcode_date;
  string before;
  istringstream iss;
  string *line_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(before.field_2._M_local_buf + 8),line,8);
  std::__cxx11::string::string((string *)(logcode_date.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(time.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(thread_lineinfo.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_218);
  std::operator>>((istream *)(before.field_2._M_local_buf + 8),
                  (string *)(time.field_2._M_local_buf + 8));
  do {
    bVar1 = IsLoggingPrefix((string *)((long)&time.field_2 + 8));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)(logcode_date.field_2._M_local_buf + 8)," ");
      }
      std::operator>>((istream *)(before.field_2._M_local_buf + 8),
                      (string *)(thread_lineinfo.field_2._M_local_buf + 8));
      std::operator>>((istream *)(before.field_2._M_local_buf + 8),(string *)local_218);
      bVar2 = std::__cxx11::string::empty();
      tmp.field_2._M_local_buf[0xf] = '\0';
      if ((bVar2 & 1) != 0) {
        LogMessageVoidify::LogMessageVoidify(&local_24d);
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_260,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                   ,0x1a1);
        tmp.field_2._M_local_buf[0xf] = '\x01';
        poVar6 = LogMessage::stream(&local_260);
        poVar6 = std::operator<<(poVar6,"Check failed: !thread_lineinfo.empty() ");
        LogMessageVoidify::operator&(&local_24d,poVar6);
      }
      if ((tmp.field_2._M_local_buf[0xf] & 1U) != 0) {
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_260);
      }
      std::__cxx11::string::size();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_218);
      if (*pcVar5 != ']') {
        std::__cxx11::string::string((string *)local_288);
        std::operator>>((istream *)(before.field_2._M_local_buf + 8),(string *)local_288);
        bVar2 = std::__cxx11::string::empty();
        _result_1._7_1_ = 0;
        if ((bVar2 & 1) != 0) {
          LogMessageVoidify::LogMessageVoidify(&local_289);
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_2a0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                     ,0x1a6);
          _result_1._7_1_ = 1;
          poVar6 = LogMessage::stream(&local_2a0);
          poVar6 = std::operator<<(poVar6,"Check failed: !tmp.empty() ");
          LogMessageVoidify::operator&(&local_289,poVar6);
        }
        if ((_result_1._7_1_ & 1) != 0) {
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2a0);
        }
        local_2b1 = GetReferenceableValue(']');
        std::__cxx11::string::size();
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_288);
        local_2b2 = GetReferenceableValue(*pcVar5);
        local_2b0 = Check_EQImpl<char,char>(&local_2b1,&local_2b2,"\']\' == tmp[tmp.size() - 1]");
        if (local_2b0 != (string *)0x0) {
          CheckOpString::CheckOpString(&local_2d0,local_2b0);
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_2c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                     ,0x1a7,&local_2d0);
          LogMessage::stream(&local_2c8);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2c8);
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index,
                       "THREADID ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_288);
        std::__cxx11::string::operator=((string *)local_218,(string *)&index);
        std::__cxx11::string::~string((string *)&index);
        std::__cxx11::string::~string((string *)local_288);
      }
      _result = (_Check_string *)std::__cxx11::string::find((char)local_218,0x3a);
      local_308 = GetReferenceableValue(0xffffffffffffffff);
      local_310 = GetReferenceableValue((unsigned_long)_result);
      local_300 = Check_NEImpl<unsigned_long,unsigned_long>
                            (&local_308,&local_310,"string::npos != index");
      if (local_300 != (string *)0x0) {
        CheckOpString::CheckOpString(&local_328,local_300);
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_320,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
                   ,0x1ab,&local_328);
        LogMessage::stream(&local_320);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_320);
      }
      std::__cxx11::string::substr((ulong)((long)&rest.field_2 + 8),(ulong)local_218);
      std::operator+(&local_348,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&rest.field_2 + 8),"LINE]");
      std::__cxx11::string::operator=((string *)local_218,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_388);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(before.field_2._M_local_buf + 8),(string *)local_388);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)((long)&time.field_2 + 8));
      std::operator+(&local_3e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&logcode_date.field_2 + 8),*pcVar5);
      std::operator+(&local_3c8,&local_3e8,"DATE TIME__ ");
      std::operator+(&local_3a8,&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218)
      ;
      MungeLine(&local_408,(string *)local_388);
      std::operator+(__return_storage_ptr__,&local_3a8,&local_408);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      local_24c = 1;
      std::__cxx11::string::~string((string *)local_388);
      goto LAB_0013045c;
    }
    std::operator+(&local_248," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&time.field_2 + 8));
    std::__cxx11::string::operator+=
              ((string *)(logcode_date.field_2._M_local_buf + 8),(string *)&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    piVar3 = std::operator>>((istream *)(before.field_2._M_local_buf + 8),
                             (string *)(time.field_2._M_local_buf + 8));
    bVar2 = std::ios::operator!((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
  } while ((bVar2 & 1) == 0);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)(logcode_date.field_2._M_local_buf + 8));
  local_24c = 1;
LAB_0013045c:
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)(thread_lineinfo.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(time.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(logcode_date.field_2._M_local_buf + 8));
  std::__cxx11::istringstream::~istringstream((istringstream *)(before.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static inline string MungeLine(const string& line) {
  std::istringstream iss(line);
  string before, logcode_date, time, thread_lineinfo;
  iss >> logcode_date;
  while (!IsLoggingPrefix(logcode_date)) {
    before += " " + logcode_date;
    if (!(iss >> logcode_date)) {
      // We cannot find the header of log output.
      return before;
    }
  }
  if (!before.empty()) before += " ";
  iss >> time;
  iss >> thread_lineinfo;
  CHECK(!thread_lineinfo.empty());
  if (thread_lineinfo[thread_lineinfo.size() - 1] != ']') {
    // We found thread ID.
    string tmp;
    iss >> tmp;
    CHECK(!tmp.empty());
    CHECK_EQ(']', tmp[tmp.size() - 1]);
    thread_lineinfo = "THREADID " + tmp;
  }
  size_t index = thread_lineinfo.find(':');
  CHECK_NE(string::npos, index);
  thread_lineinfo = thread_lineinfo.substr(0, index+1) + "LINE]";
  string rest;
  std::getline(iss, rest);
  return (before + logcode_date[0] + "DATE TIME__ " + thread_lineinfo +
          MungeLine(rest));
}